

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_3eca4::updateNames::NameMapper::~NameMapper(NameMapper *this)

{
  wasm::WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::PostWalker<NameMapper,_wasm::UnifiedExpressionVisitor<NameMapper,_void>_>_>
               );
  operator_delete(this,0x138);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }